

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

bool legacy::globalMatchesCrit
               (GlobalVariable *G,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parsedCrit)

{
  bool bVar1;
  reference ppVar2;
  undefined1 auVar3 [16];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  Value *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  StringRef *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_28 [5];
  
  local_28[0]._M_current =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_ffffffffffffff88);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (__normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(local_28);
    if (ppVar2->first == -1) {
      in_stack_ffffffffffffff88 = (Value *)&ppVar2->second;
      auVar3 = llvm::Value::getName();
      llvm::StringRef::str_abi_cxx11_(in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffff97 =
           std::operator==(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
      if ((in_stack_ffffffffffffff97 & 1) != 0) {
        llvm::errs();
        llvm::raw_ostream::operator<<(auVar3._8_8_,auVar3._0_8_);
        llvm::raw_ostream::operator<<(auVar3._8_8_,auVar3._0_8_);
        llvm::raw_ostream::operator<<(auVar3._8_8_,auVar3._0_8_);
        llvm::operator<<((raw_ostream *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
        llvm::raw_ostream::operator<<(auVar3._8_8_,auVar3._0_8_);
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(local_28);
  } while( true );
}

Assistant:

static bool
globalMatchesCrit(const llvm::GlobalVariable &G,
                  const std::vector<std::pair<int, std::string>> &parsedCrit) {
    for (const auto &c : parsedCrit) {
        if (c.first != -1)
            continue;
        if (c.second == G.getName().str()) {
            llvm::errs() << "Matched global variable " << c.second << " to:\n"
                         << G << "\n";
            return true;
        }
    }

    return false;
}